

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageInputsXrShareSpatialAnchorCompleteBD
                   (XrSenseDataProviderBD provider,XrFutureEXT future,
                   XrFutureCompletionEXT *completion)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  ValidateXrHandleResult VVar3;
  XrResult XVar4;
  char *pcVar5;
  long lVar6;
  GenValidUsageXrInstanceInfo *instance_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar7;
  string out;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  ostringstream oss;
  string local_270;
  string local_250;
  XrSenseDataProviderBD local_230;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_208;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  string local_1c0;
  string local_1a0 [3];
  ios_base local_130 [264];
  
  local_228.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0[0]._M_dataplus._M_p._0_4_ = 0x3ba0b988;
  local_230 = provider;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSenseDataProviderBD_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &local_228,&local_230,(XrObjectType *)local_1a0);
  VVar3 = VerifyXrSenseDataProviderBDHandle(&local_230);
  if (VVar3 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar7 = HandleInfo<XrSenseDataProviderBD_T_*>::getWithInstanceInfo
                      (&g_sensedataproviderbd_info,local_230);
    instance_info = pVar7.second;
    paVar1 = &local_1a0[0].field_2;
    local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
    if (completion == (XrFutureCompletionEXT *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"VUID-xrShareSpatialAnchorCompleteBD-completion-parameter","");
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_270,"xrShareSpatialAnchorCompleteBD","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_1f0,&local_228);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,
                 "Invalid NULL for XrFutureCompletionEXT \"completion\" which is not optional and must be non-NULL"
                 ,"");
      CoreValidLogMessage(instance_info,local_1a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_270,
                          &local_1f0,&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"xrShareSpatialAnchorCompleteBD","");
      XVar4 = ValidateXrStruct(instance_info,local_1a0,&local_228,false,true,completion);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (XVar4 == XR_SUCCESS) {
        XVar4 = XR_SUCCESS;
        goto LAB_0029bea9;
      }
      local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"VUID-xrShareSpatialAnchorCompleteBD-completion-parameter","");
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_270,"xrShareSpatialAnchorCompleteBD","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_208,&local_228);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,
                 "Command xrShareSpatialAnchorCompleteBD param completion is invalid","");
      CoreValidLogMessage(instance_info,local_1a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_270,
                          &local_208,&local_250);
      local_1f0.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_208.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_1f0.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_208.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        local_1f0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_208.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1f0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_208.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
    }
    if (local_1f0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
    }
    XVar4 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Invalid XrSenseDataProviderBD handle \"provider\" ",0x30);
    local_250._M_dataplus._M_p = (pointer)local_230;
    paVar1 = &local_270.field_2;
    local_270._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_270,'\x12');
    *local_270._M_dataplus._M_p = '0';
    local_270._M_dataplus._M_p[1] = 'x';
    pcVar5 = local_270._M_dataplus._M_p + (local_270._M_string_length - 1);
    lVar6 = 0;
    do {
      bVar2 = *(byte *)((long)&local_250._M_dataplus._M_p + lVar6);
      *pcVar5 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
      pcVar5[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
      lVar6 = lVar6 + 1;
      pcVar5 = pcVar5 + -2;
    } while (lVar6 != 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,local_270._M_dataplus._M_p,local_270._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    local_270._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_270,"VUID-xrShareSpatialAnchorCompleteBD-provider-parameter","");
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,"xrShareSpatialAnchorCompleteBD","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1d8,&local_228);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_270,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_250,&local_1d8,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if (local_1d8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
    XVar4 = XR_ERROR_HANDLE_INVALID;
  }
LAB_0029bea9:
  if (local_228.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return XVar4;
}

Assistant:

XrResult GenValidUsageInputsXrShareSpatialAnchorCompleteBD(
XrSenseDataProviderBD provider,
XrFutureEXT future,
XrFutureCompletionEXT* completion) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(provider, XR_OBJECT_TYPE_SENSE_DATA_PROVIDER_BD);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSenseDataProviderBDHandle(&provider);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSenseDataProviderBD handle \"provider\" ";
                oss << HandleToHexString(provider);
                CoreValidLogMessage(nullptr, "VUID-xrShareSpatialAnchorCompleteBD-provider-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrShareSpatialAnchorCompleteBD",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_sensedataproviderbd_info.getWithInstanceInfo(provider);
        GenValidUsageXrHandleInfo *gen_sensedataproviderbd_info = info_with_instance.first;
        (void)gen_sensedataproviderbd_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == completion) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrShareSpatialAnchorCompleteBD-completion-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrShareSpatialAnchorCompleteBD", objects_info,
                                "Invalid NULL for XrFutureCompletionEXT \"completion\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrFutureCompletionEXT is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrShareSpatialAnchorCompleteBD", objects_info,
                                                        false, true, completion);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrShareSpatialAnchorCompleteBD-completion-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrShareSpatialAnchorCompleteBD",
                                objects_info,
                                "Command xrShareSpatialAnchorCompleteBD param completion is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}